

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

void __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
          (PersistentStorageJson *this,string *aFileName)

{
  allocator local_49;
  string local_48;
  string *local_18;
  string *aFileName_local;
  PersistentStorageJson *this_local;
  
  local_18 = aFileName;
  aFileName_local = (string *)this;
  PersistentStorage::PersistentStorage(&this->super_PersistentStorage);
  (this->super_PersistentStorage)._vptr_PersistentStorage =
       (_func_int **)&PTR__PersistentStorageJson_0046a230;
  std::__cxx11::string::string((string *)&this->mFileName,(string *)local_18);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&this->mCache,(nullptr_t)0x0);
  (this->mStorageLock).mPlatform = (sem_t *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"thrcomm_json_storage",&local_49);
  os::semaphore::SemaphoreOpen(&local_48,&this->mStorageLock);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

PersistentStorageJson::PersistentStorageJson(std::string const &aFileName)
    : mFileName(aFileName)
    , mStorageLock()
{
    SemaphoreOpen("thrcomm_json_storage", mStorageLock);
}